

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# download.cc
# Opt level: O3

int connect_server(http_t *info)

{
  ushort uVar1;
  int sock;
  int iVar2;
  unsigned_long uVar3;
  undefined8 uVar4;
  char *__format;
  sockaddr local_28;
  
  uVar1 = (ushort)info->port;
  sock = socket(2,1,0);
  if (sock == -1) {
    printf("[%s][%s(%d)]:socket create failed\n","MSG_ERROR","connect_server",0xb0);
    close(-1);
  }
  else {
    iVar2 = set_socket_option(sock);
    if (iVar2 != -1) {
      uVar3 = dns(info->host_name);
      if (uVar3 == 0xffffffffffffffff) {
        __format = "[%s][%s(%d)]:Get Dns Failed\n";
        uVar4 = 0xbb;
      }
      else {
        local_28.sa_data[6] = '\0';
        local_28.sa_data[7] = '\0';
        local_28.sa_data[8] = '\0';
        local_28.sa_data[9] = '\0';
        local_28.sa_data[10] = '\0';
        local_28.sa_data[0xb] = '\0';
        local_28.sa_data[0xc] = '\0';
        local_28.sa_data[0xd] = '\0';
        local_28.sa_family = 2;
        local_28.sa_data._0_2_ = uVar1 << 8 | uVar1 >> 8;
        local_28.sa_data._2_4_ = SUB84(uVar3,0);
        iVar2 = connect(sock,&local_28,0x10);
        if (iVar2 != -1) {
          info->sock = sock;
          return 0;
        }
        __format = "[%s][%s(%d)]:connect failed: %m\n";
        uVar4 = 0xc6;
      }
      printf(__format,"MSG_ERROR","connect_server",uVar4);
    }
    close(sock);
  }
  return -1;
}

Assistant:

int connect_server(http_t *info) {
  int sockfd;
  struct sockaddr_in server;
  unsigned long addr = 0;
  unsigned short port = info->port;

  sockfd = socket(AF_INET, SOCK_STREAM, 0);
  if (-1 == sockfd) {
    lprintf(MSG_ERROR, "socket create failed\n");
    close(sockfd);
    return -1;
  }

  if (-1 == set_socket_option(sockfd)) {
    close(sockfd);
    return -1;
  }

  if ((addr = dns(info->host_name)) == -1) {
    lprintf(MSG_ERROR, "Get Dns Failed\n");
    close(sockfd);
    return -1;
  }
  memset(&server, 0, sizeof(server));
  server.sin_family = AF_INET;
  server.sin_port = htons(port);
  server.sin_addr.s_addr = addr;

  if (-1 ==
      connect(sockfd, (struct sockaddr *)&server, sizeof(struct sockaddr))) {
    lprintf(MSG_ERROR, "connect failed: %m\n");
    close(sockfd);
    return -1;
  }

  info->sock = sockfd;
  return 0;
}